

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Matches * __thiscall
Catch::TestSpec::matchesByFilter
          (TestSpec *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases,
          IConfig *config)

{
  bool bVar1;
  reference this_00;
  undefined8 in_RDX;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *in_RSI;
  Filter *in_RDI;
  TestCaseHandle *test;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range2;
  vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
  currentMatches;
  Filter *filter;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *__range1;
  Matches *matches;
  value_type *in_stack_fffffffffffffef8;
  FilterMatch *in_stack_ffffffffffffff00;
  reference __args;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  Filter *filter_00;
  vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
  *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  local_80;
  undefined8 local_78;
  reference local_58;
  Filter *local_50;
  __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
  local_48 [4];
  undefined1 local_21;
  undefined8 local_18;
  
  local_21 = 0;
  filter_00 = in_RDI;
  local_18 = in_RDX;
  std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::vector
            ((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
             0x18244e);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::size(in_RSI);
  std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::reserve
            (in_stack_ffffffffffffff30,(size_type)filter_00);
  local_48[0]._M_current =
       (Filter *)
       std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::begin
                 ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
                  in_stack_fffffffffffffef8);
  local_50 = (Filter *)
             std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::end
                       ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *
                        )in_stack_fffffffffffffef8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
                             *)in_stack_ffffffffffffff00,
                            (__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
                             *)in_stack_fffffffffffffef8), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
               ::operator*(local_48);
    std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>::
    vector((vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_> *)
           0x1824de);
    local_78 = local_18;
    local_80._M_current =
         (TestCaseHandle *)
         std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                   ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                    in_stack_fffffffffffffef8);
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
              ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
               in_stack_fffffffffffffef8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                               *)in_stack_ffffffffffffff00,
                              (__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                               *)in_stack_fffffffffffffef8), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                ::operator*(&local_80);
      in_stack_ffffffffffffff17 =
           isThrowSafe((TestCaseHandle *)in_stack_ffffffffffffff00,
                       (IConfig *)in_stack_fffffffffffffef8);
      if ((bool)in_stack_ffffffffffffff17) {
        __args = local_58;
        TestCaseHandle::getTestCaseInfo(this_00);
        in_stack_ffffffffffffff16 =
             Filter::matches((Filter *)in_stack_ffffffffffffff48,
                             (TestCaseInfo *)in_stack_ffffffffffffff40);
        if ((bool)in_stack_ffffffffffffff16) {
          std::vector<Catch::TestCaseHandle_const*,std::allocator<Catch::TestCaseHandle_const*>>::
          emplace_back<Catch::TestCaseHandle_const*>
                    ((vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                      *)CONCAT17(in_stack_ffffffffffffff17,
                                 CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                     (TestCaseHandle **)__args);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
      ::operator++(&local_80);
    }
    in_stack_ffffffffffffff00 = (FilterMatch *)&stack0xffffffffffffff30;
    extractFilterName_abi_cxx11_(filter_00);
    std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>::
    vector(in_stack_ffffffffffffff50,
           (vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_> *)
           in_stack_ffffffffffffff48);
    std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
    push_back((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *
              )in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    FilterMatch::~FilterMatch(in_stack_ffffffffffffff00);
    std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>::
    ~vector((vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_> *
            )CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
    __gnu_cxx::
    __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
    ::operator++(local_48);
  }
  return (Matches *)in_RDI;
}

Assistant:

TestSpec::Matches TestSpec::matchesByFilter( std::vector<TestCaseHandle> const& testCases, IConfig const& config ) const {
        Matches matches;
        matches.reserve( m_filters.size() );
        for ( auto const& filter : m_filters ) {
            std::vector<TestCaseHandle const*> currentMatches;
            for ( auto const& test : testCases )
                if ( isThrowSafe( test, config ) &&
                     filter.matches( test.getTestCaseInfo() ) )
                    currentMatches.emplace_back( &test );
            matches.push_back(
                FilterMatch{ extractFilterName( filter ), currentMatches } );
        }
        return matches;
    }